

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Account.cpp
# Opt level: O2

string * __thiscall
Account::GetCharacterList_abi_cxx11_(string *__return_storage_ptr__,Account *this)

{
  pointer pbVar1;
  ostream *poVar2;
  int iVar3;
  pointer pbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> char_name;
  stringstream ss;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  pbVar1 = (this->m_characters).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  iVar3 = 1;
  for (pbVar4 = (this->m_characters).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1) {
    std::__cxx11::string::string((string *)&char_name,(string *)pbVar4);
    poVar2 = (ostream *)std::ostream::operator<<(local_1a8,iVar3);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = std::operator<<(poVar2,(string *)&char_name);
    std::operator<<(poVar2,"\r\n");
    std::__cxx11::string::~string((string *)&char_name);
    iVar3 = iVar3 + 1;
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string Account::GetCharacterList() {
    std::stringstream ss;
    int count = 0;
    for(auto char_name: m_characters) {
        ss << ++count << " " << char_name << "\r\n";
    }
    return ss.str();
}